

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O2

SharedPtr<Filter> __thiscall
Rml::FilterBasicInstancer::InstanceFilter
          (FilterBasicInstancer *this,String *name,PropertyDictionary *properties)

{
  Property *this_00;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  float angle;
  SharedPtr<Filter> SVar2;
  SharedPtr<Rml::FilterBasic> filter;
  _func_int **local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,name[3].field_2._M_local_buf[8]);
  if (this_00 == (Property *)0x0) {
    (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    angle = Property::Get<float>(this_00);
    if (this_00->unit == DEG) {
      angle = Math::DegreesToRadians(angle);
    }
    else if (this_00->unit == PERCENT) {
      angle = angle * 0.01;
    }
    ::std::make_shared<Rml::FilterBasic>();
    ::std::__cxx11::string::_M_assign((string *)(local_28 + 1));
    _Var1._M_pi = _Stack_20._M_pi;
    *(float *)(local_28 + 5) = angle;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_FilterInstancer)._vptr_FilterInstancer = local_28;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var1._M_pi;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
    _Var1._M_pi = extraout_RDX_00;
  }
  SVar2.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  SVar2.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar2.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBasicInstancer::InstanceFilter(const String& name, const PropertyDictionary& properties)
{
	const Property* p_value = properties.GetProperty(ids.value);
	if (!p_value)
		return nullptr;

	float value = p_value->Get<float>();
	if (p_value->unit == Unit::PERCENT)
		value *= 0.01f;
	else if (p_value->unit == Unit::DEG)
		value = Rml::Math::DegreesToRadians(value);

	auto filter = MakeShared<FilterBasic>();
	if (filter->Initialise(name, value))
		return filter;

	return nullptr;
}